

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

bool __thiscall ON_StringBuffer::GrowBuffer(ON_StringBuffer *this,size_t buffer_capacity)

{
  char *pcVar1;
  size_t local_38;
  size_t buffer_capacity_local;
  ON_StringBuffer *this_local;
  
  if ((this->m_buffer_capacity < buffer_capacity) ||
     ((this->m_buffer == (char *)0x0 && (this->m_buffer_capacity != 0)))) {
    if ((this->m_heap_buffer_capacity < buffer_capacity) || (this->m_heap_buffer == (char *)0x0)) {
      if ((this->m_heap_buffer != (char *)0x0) && (this->m_heap_buffer != (char *)0x0)) {
        operator_delete__(this->m_heap_buffer);
      }
      pcVar1 = (char *)operator_new__(buffer_capacity,(nothrow_t *)&std::nothrow);
      this->m_heap_buffer = pcVar1;
      local_38 = buffer_capacity;
      if (this->m_heap_buffer == (char *)0x0) {
        local_38 = 0;
      }
      this->m_heap_buffer_capacity = local_38;
    }
    this->m_buffer = this->m_heap_buffer;
    this->m_buffer_capacity = this->m_heap_buffer_capacity;
    this_local._7_1_ = buffer_capacity <= this->m_buffer_capacity;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_StringBuffer::GrowBuffer(
  size_t buffer_capacity
  )
{
  if (buffer_capacity <= m_buffer_capacity && (nullptr != m_buffer || 0 == m_buffer_capacity))
    return true;

  if (buffer_capacity > m_heap_buffer_capacity || nullptr == m_heap_buffer)
  {
    if (nullptr != m_heap_buffer)
      delete[] m_heap_buffer;
    m_heap_buffer = new(std::nothrow) char[buffer_capacity];
    m_heap_buffer_capacity = (nullptr != m_heap_buffer) ? buffer_capacity : 0;
  }

  m_buffer = m_heap_buffer;
  m_buffer_capacity = m_heap_buffer_capacity;

  return (buffer_capacity <= m_buffer_capacity);
}